

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionProxy::Copy(FunctionProxy *this,FunctionProxy *other)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionTypeWeakRefList *list;
  FunctionProxy *other_local;
  FunctionProxy *this_local;
  
  if (other == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x5d2,"(other)","other");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  SetIsTopLevel(other,(bool)((byte)this->field_0x44 >> 1 & 1));
  bVar2 = IsPublicLibraryCode(this);
  if (bVar2) {
    SetIsPublicLibraryCode(other);
  }
  bVar2 = IsJsBuiltInCode(this);
  if (bVar2) {
    SetIsJsBuiltInCode(other);
  }
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->deferredPrototypeType,&this->deferredPrototypeType);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->undeferredFunctionType,&this->undeferredFunctionType);
  list = GetFunctionObjectTypeList(this);
  SetFunctionObjectTypeList(other,list);
  return;
}

Assistant:

void FunctionProxy::Copy(FunctionProxy* other)
    {
        Assert(other);

        other->SetIsTopLevel(this->m_isTopLevel);

        if (this->IsPublicLibraryCode())
        {
            other->SetIsPublicLibraryCode();
        }

        if (this->IsJsBuiltInCode())
        {
            other->SetIsJsBuiltInCode();
        }

#define CopyDeferParseField(field) other->field = this->field;
        CopyDeferParseField(deferredPrototypeType);
        CopyDeferParseField(undeferredFunctionType);
#undef CopyDeferParseField

        other->SetFunctionObjectTypeList(this->GetFunctionObjectTypeList());
    }